

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  Message *pMVar2;
  Message local_38;
  Int32 local_2c;
  char *pcStack_28;
  Int32 result;
  char *str_val;
  char *pcStack_18;
  Int32 default_val_local;
  char *var_local;
  
  str_val._4_4_ = default_val;
  pcStack_18 = var;
  pcStack_28 = posix::GetEnv(var);
  if (pcStack_28 == (char *)0x0) {
    var_local._4_4_ = str_val._4_4_;
  }
  else {
    Message::Message(&local_38);
    pMVar2 = Message::operator<<(&local_38,(char (*) [35])"The value of environment variable ");
    pMVar2 = Message::operator<<(pMVar2,&stack0xffffffffffffffe8);
    bVar1 = ParseInt32(pMVar2,pcStack_28,&local_2c);
    Message::~Message((Message *)0x1507db);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      exit(1);
    }
    var_local._4_4_ = local_2c;
  }
  return var_local._4_4_;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}